

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhysicalDevice.cpp
# Opt level: O0

vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
* myvk::PhysicalDevice::Fetch(Ptr<Instance> *instance)

{
  PFN_vkEnumeratePhysicalDevices p_Var1;
  element_type *peVar2;
  VkInstance pVVar3;
  VkPhysicalDevice_T **ppVVar4;
  shared_ptr<myvk::PhysicalDevice> *in_RSI;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *in_RDI;
  uint32_t i;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> devices;
  uint32_t device_count;
  vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
  *ret;
  shared_ptr<myvk::PhysicalDevice> *in_stack_ffffffffffffff58;
  shared_ptr<myvk::PhysicalDevice> *this;
  allocator_type *in_stack_ffffffffffffff70;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *this_00;
  shared_ptr<myvk::Instance> *__args;
  uint local_4c;
  allocator<VkPhysicalDevice_T_*> local_31;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> local_30;
  uint local_14;
  shared_ptr<myvk::PhysicalDevice> *local_10;
  
  local_14 = 0;
  this_00 = in_RDI;
  __args = (shared_ptr<myvk::Instance> *)vkEnumeratePhysicalDevices;
  local_10 = in_RSI;
  peVar2 = std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2c140b);
  pVVar3 = Instance::GetHandle(peVar2);
  (*(code *)__args)(pVVar3,&local_14,0);
  std::allocator<VkPhysicalDevice_T_*>::allocator((allocator<VkPhysicalDevice_T_*> *)0x2c1444);
  std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::vector
            (this_00,(size_type)in_RDI,in_stack_ffffffffffffff70);
  std::allocator<VkPhysicalDevice_T_*>::~allocator(&local_31);
  p_Var1 = vkEnumeratePhysicalDevices;
  peVar2 = std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2c1480);
  pVVar3 = Instance::GetHandle(peVar2);
  ppVVar4 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::data
                      ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)
                       0x2c1499);
  (*p_Var1)(pVVar3,&local_14,ppVVar4);
  std::
  vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
  ::vector((vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
            *)0x2c14c1);
  std::
  vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
  ::resize((vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
            *)this_00,(size_type)in_RDI);
  for (local_4c = 0; local_4c < local_14; local_4c = local_4c + 1) {
    this = local_10;
    std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::operator[]
              (&local_30,(ulong)local_4c);
    std::
    make_shared<myvk::PhysicalDevice,std::shared_ptr<myvk::Instance>const&,VkPhysicalDevice_T*&>
              (__args,(VkPhysicalDevice_T **)this_00);
    std::
    vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
    ::operator[]((vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
                  *)in_RDI,(ulong)local_4c);
    std::shared_ptr<myvk::PhysicalDevice>::operator=(this,in_stack_ffffffffffffff58);
    std::shared_ptr<myvk::PhysicalDevice>::~shared_ptr((shared_ptr<myvk::PhysicalDevice> *)0x2c1547)
    ;
  }
  std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::~vector
            ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)pVVar3);
  return (vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
          *)this_00;
}

Assistant:

std::vector<Ptr<PhysicalDevice>> PhysicalDevice::Fetch(const Ptr<Instance> &instance) {
	uint32_t device_count = 0;
	vkEnumeratePhysicalDevices(instance->GetHandle(), &device_count, nullptr);
	std::vector<VkPhysicalDevice> devices(device_count);
	vkEnumeratePhysicalDevices(instance->GetHandle(), &device_count, devices.data());

	std::vector<Ptr<PhysicalDevice>> ret;
	ret.resize(device_count);
	for (uint32_t i = 0; i < device_count; ++i) {
		ret[i] = std::make_shared<PhysicalDevice>(instance, devices[i]);
	}
	return ret;
}